

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_DetermineFramesPerBuffer
                  (PaAlsaStreamComponent *self,PaStreamParameters *params,
                  unsigned_long framesPerUserBuffer,double sampleRate,snd_pcm_hw_params_t *hwParams,
                  int *accurate)

{
  int iVar1;
  int iVar2;
  pthread_t pVar3;
  long lVar4;
  char *pcVar5;
  double local_d0;
  double local_c8;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  int __pa_unsure_error_id_4;
  int __pa_unsure_error_id_3;
  int __pa_unsure_error_id_2;
  snd_pcm_uframes_t minmax_diff;
  snd_pcm_uframes_t max;
  snd_pcm_uframes_t min;
  int __pa_unsure_error_id_1;
  int __pa_unsure_error_id;
  uint minPeriods;
  uint maxPeriods;
  uint numPeriods;
  int dir;
  unsigned_long framesPerHostBuffer;
  unsigned_long bufferSize;
  int *piStack_38;
  PaError result;
  int *accurate_local;
  snd_pcm_hw_params_t *hwParams_local;
  double sampleRate_local;
  unsigned_long framesPerUserBuffer_local;
  PaStreamParameters *params_local;
  PaAlsaStreamComponent *self_local;
  
  bufferSize._4_4_ = 0;
  maxPeriods = 0;
  piStack_38 = accurate;
  accurate_local = (int *)hwParams;
  hwParams_local = (snd_pcm_hw_params_t *)sampleRate;
  sampleRate_local = (double)framesPerUserBuffer;
  framesPerUserBuffer_local = (unsigned_long)params;
  params_local = (PaStreamParameters *)self;
  framesPerHostBuffer =
       PaAlsa_GetFramesPerHostBuffer(framesPerUserBuffer,params->suggestedLatency,sampleRate);
  minPeriods = numPeriods_;
  __pa_unsure_error_id = 0;
  __pa_unsure_error_id_1 = numPeriods_;
  maxPeriods = 0;
  min._4_4_ = (*(code *)alsa_snd_pcm_hw_params_get_periods_min)
                        (accurate_local,&__pa_unsure_error_id_1,&maxPeriods);
  if (min._4_4_ < 0) {
    pVar3 = pthread_self();
    iVar1 = pthread_equal(pVar3,paUnixMainThread);
    if (iVar1 != 0) {
      lVar4 = (long)min._4_4_;
      pcVar5 = (*alsa_snd_strerror)(min._4_4_);
      PaUtil_SetLastHostErrorInfo(paALSA,lVar4,pcVar5);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_hw_params_get_periods_min( hwParams, &minPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2326\n"
                     );
    bufferSize._4_4_ = -9999;
  }
  else {
    min._0_4_ = (*(code *)alsa_snd_pcm_hw_params_get_periods_max)
                          (accurate_local,&__pa_unsure_error_id,&maxPeriods);
    if ((int)min < 0) {
      pVar3 = pthread_self();
      iVar1 = pthread_equal(pVar3,paUnixMainThread);
      if (iVar1 != 0) {
        lVar4 = (long)(int)min;
        pcVar5 = (*alsa_snd_strerror)((int)min);
        PaUtil_SetLastHostErrorInfo(paALSA,lVar4,pcVar5);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_get_periods_max( hwParams, &maxPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2327\n"
                       );
      bufferSize._4_4_ = -9999;
    }
    else {
      if ((uint)__pa_unsure_error_id < 2) {
        __assert_fail("maxPeriods > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x918,
                      "PaError PaAlsaStreamComponent_DetermineFramesPerBuffer(PaAlsaStreamComponent *, const PaStreamParameters *, unsigned long, double, snd_pcm_hw_params_t *, int *)"
                     );
      }
      if (minPeriods < (uint)__pa_unsure_error_id_1) {
        local_a8 = __pa_unsure_error_id_1;
      }
      else {
        local_a8 = minPeriods;
      }
      if ((uint)__pa_unsure_error_id < local_a8) {
        local_ac = __pa_unsure_error_id;
      }
      else {
        if (minPeriods < (uint)__pa_unsure_error_id_1) {
          local_b0 = __pa_unsure_error_id_1;
        }
        else {
          local_b0 = minPeriods;
        }
        local_ac = local_b0;
      }
      minPeriods = local_ac;
      _numPeriods = (double)(framesPerHostBuffer / local_ac);
      if (sampleRate_local != 0.0) {
        _numPeriods = (double)PaAlsa_AlignForward((unsigned_long)_numPeriods,
                                                  (unsigned_long)sampleRate_local);
        if ((ulong)_numPeriods < (ulong)sampleRate_local) {
          if ((ulong)sampleRate_local % (ulong)_numPeriods != 0) {
            __assert_fail("framesPerUserBuffer % framesPerHostBuffer == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0x92d,
                          "PaError PaAlsaStreamComponent_DetermineFramesPerBuffer(PaAlsaStreamComponent *, const PaStreamParameters *, unsigned long, double, snd_pcm_hw_params_t *, int *)"
                         );
          }
          iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                            (params_local[1].hostApiSpecificStreamInfo,accurate_local,_numPeriods,0)
          ;
          if (iVar1 < 0) {
            iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                              (params_local[1].hostApiSpecificStreamInfo,accurate_local,
                               (long)_numPeriods << 1,0);
            if (iVar1 == 0) {
              _numPeriods = (double)((long)_numPeriods << 1);
            }
            else {
              iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                                (params_local[1].hostApiSpecificStreamInfo,accurate_local,
                                 (ulong)_numPeriods >> 1,0);
              if (iVar1 == 0) {
                _numPeriods = (double)((ulong)_numPeriods >> 1);
              }
            }
          }
        }
        else {
          if ((ulong)_numPeriods % (ulong)sampleRate_local != 0) {
            __assert_fail("framesPerHostBuffer % framesPerUserBuffer == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0x938,
                          "PaError PaAlsaStreamComponent_DetermineFramesPerBuffer(PaAlsaStreamComponent *, const PaStreamParameters *, unsigned long, double, snd_pcm_hw_params_t *, int *)"
                         );
          }
          iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                            (params_local[1].hostApiSpecificStreamInfo,accurate_local,_numPeriods,0)
          ;
          if (iVar1 < 0) {
            iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                              (params_local[1].hostApiSpecificStreamInfo,accurate_local,
                               (long)_numPeriods + (long)sampleRate_local,0);
            if (iVar1 == 0) {
              _numPeriods = (double)((long)sampleRate_local + (long)_numPeriods);
            }
            else {
              iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_period_size)
                                (params_local[1].hostApiSpecificStreamInfo,accurate_local,
                                 (long)_numPeriods - (long)sampleRate_local,0);
              if (iVar1 == 0) {
                _numPeriods = (double)((long)_numPeriods - (long)sampleRate_local);
              }
            }
          }
        }
      }
      max = 0;
      minmax_diff = 0;
      iVar1 = (*(code *)alsa_snd_pcm_hw_params_get_period_size_min)(accurate_local,&max,0);
      if (iVar1 < 0) {
        pVar3 = pthread_self();
        iVar2 = pthread_equal(pVar3,paUnixMainThread);
        if (iVar2 != 0) {
          pcVar5 = (*alsa_snd_strerror)(iVar1);
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar5);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_get_period_size_min( hwParams, &min, NULL )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2441\n"
                         );
        bufferSize._4_4_ = -9999;
      }
      else {
        iVar1 = (*(code *)alsa_snd_pcm_hw_params_get_period_size_max)(accurate_local,&minmax_diff,0)
        ;
        if (iVar1 < 0) {
          pVar3 = pthread_self();
          iVar2 = pthread_equal(pVar3,paUnixMainThread);
          if (iVar2 != 0) {
            pcVar5 = (*alsa_snd_strerror)(iVar1);
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar5);
          }
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_hw_params_get_period_size_max( hwParams, &max, NULL )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2442\n"
                           );
          bufferSize._4_4_ = -9999;
        }
        else {
          if ((ulong)_numPeriods < max) {
            if (minmax_diff - max == 2) {
              local_c8 = (double)(max + 1);
            }
            else {
              local_c8 = (double)max;
            }
            _numPeriods = local_c8;
          }
          else if (minmax_diff < (ulong)_numPeriods) {
            if (minmax_diff - max == 2) {
              local_d0 = (double)(minmax_diff - 1);
            }
            else {
              local_d0 = (double)minmax_diff;
            }
            _numPeriods = local_d0;
          }
          maxPeriods = 0;
          iVar1 = (*alsa_snd_pcm_hw_params_set_period_size_near)
                            ((snd_pcm_t *)params_local[1].hostApiSpecificStreamInfo,
                             (snd_pcm_hw_params_t *)accurate_local,(snd_pcm_uframes_t *)&numPeriods,
                             (int *)&maxPeriods);
          if (iVar1 < 0) {
            pVar3 = pthread_self();
            iVar2 = pthread_equal(pVar3,paUnixMainThread);
            if (iVar2 != 0) {
              pcVar5 = (*alsa_snd_strerror)(iVar1);
              PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar5);
            }
            PaUtil_DebugPrint(
                             "Expression \'alsa_snd_pcm_hw_params_set_period_size_near( self->pcm, hwParams, &framesPerHostBuffer, &dir )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 2463\n"
                             );
            bufferSize._4_4_ = -9999;
          }
          else {
            if (maxPeriods != 0) {
              *piStack_38 = 0;
            }
            *(double *)(params_local + 2) = _numPeriods;
          }
        }
      }
    }
  }
  return bufferSize._4_4_;
}

Assistant:

static PaError PaAlsaStreamComponent_DetermineFramesPerBuffer( PaAlsaStreamComponent* self, const PaStreamParameters* params,
        unsigned long framesPerUserBuffer, double sampleRate, snd_pcm_hw_params_t* hwParams, int* accurate )
{
    PaError result = paNoError;
    unsigned long bufferSize, framesPerHostBuffer;
    int dir = 0;

    /* Calculate host buffer size */
    bufferSize = PaAlsa_GetFramesPerHostBuffer(framesPerUserBuffer, params->suggestedLatency, sampleRate);

    /* Log */
    PA_DEBUG(( "%s: user-buffer (frames)           = %lu\n", __FUNCTION__, framesPerUserBuffer ));
    PA_DEBUG(( "%s: user-buffer (sec)              = %f\n",  __FUNCTION__, (double)(framesPerUserBuffer / sampleRate) ));
    PA_DEBUG(( "%s: suggested latency (sec)        = %f\n",  __FUNCTION__, params->suggestedLatency ));
    PA_DEBUG(( "%s: suggested host buffer (frames) = %lu\n", __FUNCTION__, bufferSize ));
    PA_DEBUG(( "%s: suggested host buffer (sec)    = %f\n",  __FUNCTION__, (double)(bufferSize / sampleRate) ));

#ifdef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

    if( framesPerUserBuffer != paFramesPerBufferUnspecified )
    {
        /* Preferably the host buffer size should be a multiple of the user buffer size */

        if( bufferSize > framesPerUserBuffer )
        {
            snd_pcm_uframes_t remainder = bufferSize % framesPerUserBuffer;
            if( remainder > framesPerUserBuffer / 2. )
                bufferSize += framesPerUserBuffer - remainder;
            else
                bufferSize -= remainder;

            assert( bufferSize % framesPerUserBuffer == 0 );
        }
        else if( framesPerUserBuffer % bufferSize != 0 )
        {
            /*  Find a good compromise between user specified latency and buffer size */
            if( bufferSize > framesPerUserBuffer * .75 )
            {
                bufferSize = framesPerUserBuffer;
            }
            else
            {
                snd_pcm_uframes_t newSz = framesPerUserBuffer;
                while( newSz / 2 >= bufferSize )
                {
                    if( framesPerUserBuffer % (newSz / 2) != 0 )
                    {
                        /* No use dividing any further */
                        break;
                    }
                    newSz /= 2;
                }
                bufferSize = newSz;
            }

            assert( framesPerUserBuffer % bufferSize == 0 );
        }
    }

#endif

    {
        unsigned numPeriods = numPeriods_, maxPeriods = 0, minPeriods = numPeriods_;

        /* It may be that the device only supports 2 periods for instance */
        dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_get_periods_min( hwParams, &minPeriods, &dir ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_hw_params_get_periods_max( hwParams, &maxPeriods, &dir ), paUnanticipatedHostError );
        assert( maxPeriods > 1 );

        /* Clamp to min/max */
        numPeriods = PA_MIN(maxPeriods, PA_MAX(minPeriods, numPeriods));

        PA_DEBUG(( "%s: periods min = %lu, max = %lu, req = %lu \n", __FUNCTION__, minPeriods, maxPeriods, numPeriods ));

#ifndef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

        /* Calculate period size */
        framesPerHostBuffer = (bufferSize / numPeriods);

        /* Align & test size */
        if( framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* Align to user buffer size */
            framesPerHostBuffer = PaAlsa_AlignForward(framesPerHostBuffer, framesPerUserBuffer);

            /* Test (borrowed from older implementation) */
            if( framesPerHostBuffer < framesPerUserBuffer )
            {
                assert( framesPerUserBuffer % framesPerHostBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer * 2, 0 ) == 0 )
                        framesPerHostBuffer *= 2;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer / 2, 0 ) == 0 )
                        framesPerHostBuffer /= 2;
                }
            }
            else
            {
                assert( framesPerHostBuffer % framesPerUserBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer + framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer += framesPerUserBuffer;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer - framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer -= framesPerUserBuffer;
                }
            }
        }
#endif

#ifdef PA_ALSA_USE_OBSOLETE_HOST_BUFFER_CALC

        if( framesPerUserBuffer != paFramesPerBufferUnspecified )
        {
            /* Try to get a power-of-two of the user buffer size. */
            framesPerHostBuffer = framesPerUserBuffer;
            if( framesPerHostBuffer < bufferSize )
            {
                while( bufferSize / framesPerHostBuffer > numPeriods )
                {
                    framesPerHostBuffer *= 2;
                }
                /* One extra period is preferrable to one less (should be more robust) */
                if( bufferSize / framesPerHostBuffer < numPeriods )
                {
                    framesPerHostBuffer /= 2;
                }
            }
            else
            {
                while( bufferSize / framesPerHostBuffer < numPeriods )
                {
                    if( framesPerUserBuffer % ( framesPerHostBuffer / 2 ) != 0 )
                    {
                        /* Can't be divided any further */
                        break;
                    }
                    framesPerHostBuffer /= 2;
                }
            }

            if( framesPerHostBuffer < framesPerUserBuffer )
            {
                assert( framesPerUserBuffer % framesPerHostBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer * 2, 0 ) == 0 )
                        framesPerHostBuffer *= 2;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer / 2, 0 ) == 0 )
                        framesPerHostBuffer /= 2;
                }
            }
            else
            {
                assert( framesPerHostBuffer % framesPerUserBuffer == 0 );
                if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer, 0 ) < 0 )
                {
                    if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer + framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer += framesPerUserBuffer;
                    else if( alsa_snd_pcm_hw_params_test_period_size( self->pcm, hwParams, framesPerHostBuffer - framesPerUserBuffer, 0 ) == 0 )
                        framesPerHostBuffer -= framesPerUserBuffer;
                }
            }
        }
        else
        {
            framesPerHostBuffer = bufferSize / numPeriods;
        }

        /* non-mmap mode needs a reasonably-sized buffer or it'll stutter */
        if( !self->canMmap && framesPerHostBuffer < 2048 )
            framesPerHostBuffer = 2048;
#endif
        PA_DEBUG(( "%s: suggested host buffer period   = %lu \n", __FUNCTION__, framesPerHostBuffer ));
    }

    {
        /* Get min/max period sizes and adjust our chosen */
        snd_pcm_uframes_t min = 0, max = 0, minmax_diff;
        ENSURE_( alsa_snd_pcm_hw_params_get_period_size_min( hwParams, &min, NULL ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_hw_params_get_period_size_max( hwParams, &max, NULL ), paUnanticipatedHostError );
        minmax_diff = max - min;

        if( framesPerHostBuffer < min )
        {
            PA_DEBUG(( "%s: The determined period size (%lu) is less than minimum (%lu)\n", __FUNCTION__, framesPerHostBuffer, min ));
            framesPerHostBuffer = (( minmax_diff == 2 ) ? min + 1 : min );
        }
        else if( framesPerHostBuffer > max )
        {
            PA_DEBUG(( "%s: The determined period size (%lu) is greater than maximum (%lu)\n", __FUNCTION__, framesPerHostBuffer, max ));
            framesPerHostBuffer = (( minmax_diff == 2 ) ? max - 1 : max );
        }

        PA_DEBUG(( "%s: device period minimum          = %lu\n", __FUNCTION__, min ));
        PA_DEBUG(( "%s: device period maximum          = %lu\n", __FUNCTION__, max ));
        PA_DEBUG(( "%s: host buffer period             = %lu\n", __FUNCTION__, framesPerHostBuffer ));
        PA_DEBUG(( "%s: host buffer period latency     = %f\n", __FUNCTION__, (double)( framesPerHostBuffer / sampleRate ) ));

        /* Try setting period size */
        dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_set_period_size_near( self->pcm, hwParams, &framesPerHostBuffer, &dir ), paUnanticipatedHostError );
        if( dir != 0 )
        {
            PA_DEBUG(( "%s: The configured period size is non-integer.\n", __FUNCTION__, dir ));
            *accurate = 0;
        }
    }

    /* Set result */
    self->framesPerPeriod = framesPerHostBuffer;

error:
    return result;
}